

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall Catch::TestSpecParser::preprocessPattern_abi_cxx11_(TestSpecParser *this)

{
  bool bVar1;
  string *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  size_t i;
  string *token;
  string *prefix;
  string *s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  string *local_c8;
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  string local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  s = in_RDI;
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 3));
  local_c8 = (string *)0x0;
  while (prefix = local_c8,
        psVar2 = (string *)
                 clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RSI + 4)),
        prefix < psVar2) {
    clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RSI + 4),
               (size_type)local_c8);
    std::__cxx11::string::substr((ulong)local_48,(ulong)s);
    clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RSI + 4),
               (size_type)local_c8);
    std::__cxx11::string::substr((ulong)local_68,(ulong)s);
    std::operator+(in_stack_ffffffffffffff28,in_RSI);
    std::__cxx11::string::operator=((string *)s,local_28);
    std::__cxx11::string::~string(local_28);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_48);
    local_c8 = (string *)&local_c8->field_0x1;
  }
  clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x247907);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"exclude:",(allocator *)&stack0xffffffffffffff2b);
  bVar1 = startsWith(s,prefix);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff2b);
  if (bVar1) {
    *(undefined1 *)&in_RSI->_M_string_length = 1;
    std::__cxx11::string::substr((ulong)local_a8,(ulong)s);
    std::__cxx11::string::operator=((string *)s,local_a8);
    std::__cxx11::string::~string(local_a8);
  }
  std::__cxx11::string::clear();
  *(undefined8 *)((long)&in_RSI->field_2 + 8) = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string TestSpecParser::preprocessPattern() {
        std::string token = m_patternName;
        for (std::size_t i = 0; i < m_escapeChars.size(); ++i)
            token = token.substr(0, m_escapeChars[i] - i) + token.substr(m_escapeChars[i] - i + 1);
        m_escapeChars.clear();
        if (startsWith(token, "exclude:")) {
            m_exclusion = true;
            token = token.substr(8);
        }

        m_patternName.clear();
        m_realPatternPos = 0;

        return token;
    }